

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeGlobalGet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name global)

{
  uintptr_t uVar1;
  Global *pGVar2;
  Expression *expr;
  
  pGVar2 = Module::getGlobal(this->wasm,global);
  uVar1 = (pGVar2->type).id;
  expr = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  expr->_id = GlobalGetId;
  (expr->type).id = 0;
  *(undefined8 *)(expr + 1) = 0;
  *(size_t *)(expr + 1) = global.super_IString.str._M_len;
  expr[1].type.id = (uintptr_t)global.super_IString.str._M_str;
  (expr->type).id = uVar1;
  push(this,expr);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeGlobalGet(Name global) {
  push(builder.makeGlobalGet(global, wasm.getGlobal(global)->type));
  return Ok{};
}